

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O0

void __thiscall Infector::Container::bindSingleAsNothing<GoodClassVS>(Container *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  AnyShared<GoodClassVS> *this_00;
  mapped_type *ppIVar3;
  mapped_type local_f0;
  iterator it2_1;
  exception *ex;
  iterator it2;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false> local_60 [3];
  type_index local_48;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false> local_40;
  type_index local_38;
  type_index local_30;
  Binding local_28;
  undefined1 local_11;
  Container *pCStack_10;
  bool tests;
  Container *this_local;
  
  pCStack_10 = this;
  local_11 = reduced_type_tests<GoodClassVS>();
  must_not_have<GoodClassVS>(this);
  std::type_index::type_index(&local_30,(type_info *)&GoodClassVS::typeinfo);
  Binding::Binding(&local_28,local_30,true);
  std::type_index::type_index(&local_38,(type_info *)&GoodClassVS::typeinfo);
  pmVar2 = std::
           unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
           ::operator[](&this->typeMap,&local_38);
  pmVar2->single = local_28.single;
  (pmVar2->type)._M_target = local_28.type._M_target;
  std::type_index::type_index(&local_48,(type_info *)&GoodClassVS::typeinfo);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
       ::find(&this->singleIstances,&local_48);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
       ::end(&this->singleIstances);
  bVar1 = std::__detail::operator==(&local_40,local_60);
  if (bVar1) {
    this_00 = (AnyShared<GoodClassVS> *)operator_new(0x58);
    memset(this_00,0,0x58);
    AnyShared<GoodClassVS>::AnyShared(this_00);
    local_f0 = (mapped_type)0x0;
    if (this_00 != (AnyShared<GoodClassVS> *)0x0) {
      local_f0 = (mapped_type)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x38));
    }
    std::type_index::type_index((type_index *)&it2,(type_info *)&GoodClassVS::typeinfo);
    ppIVar3 = std::
              unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
              ::operator[](&this->singleIstances,(type_index *)&it2);
    *ppIVar3 = local_f0;
  }
  return;
}

Assistant:

void Container::bindSingleAsNothing(){
        bool tests = reduced_type_tests<T>();
        (void) tests; //fix unused variable warning
        must_not_have<T>();

        typeMap[std::type_index(typeid(T))]
                = Binding(std::type_index(typeid(T)), true);

        try{
            if(singleIstances.find( std::type_index(typeid(T)) )
                                    ==singleIstances.end())
                singleIstances[std::type_index(typeid(T))]
                                = new AnyShared<T>();
        }catch(std::exception & ex){
            auto it2 = typeMap.find( std::type_index(typeid(T)) );
            typeMap.erase(it2);
            throw ex;
        }catch(...){
            auto it2 = typeMap.find( std::type_index(typeid(T)) );
            typeMap.erase(it2);
            launch_exception<ExUnkownException>();
        }
    }